

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_piece_fail_sync(torrent *this,piece_index_t piece,piece_block param_2)

{
  peer_connection *this_00;
  bool bVar1;
  pointer this_01;
  reference pppVar2;
  peer_connection *p;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_48;
  peer_iterator i;
  torrent *this_local;
  piece_block param_2_local;
  piece_index_t piece_local;
  
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    bVar1 = has_picker(this);
    if (bVar1) {
      this_01 = ::std::
                unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                ::operator->(&(this->super_torrent_hot_members).m_picker);
      span<const_int>::span((span<const_int> *)&i);
      piece_picker::restore_piece(this_01,piece,_i);
    }
    update_gauge(this);
    local_48._M_current = (peer_connection **)begin(this);
    while( true ) {
      p = (peer_connection *)end(this);
      bVar1 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                          *)&p);
      if (!bVar1) break;
      pppVar2 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&local_48);
      this_00 = *pppVar2;
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&local_48);
      bVar1 = peer_connection::is_interesting(this_00);
      if ((!bVar1) &&
         (peer_connection::update_interest(this_00),
         (*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0)) {
        bVar1 = request_a_block(this,this_00);
        if (bVar1) {
          inc_stats_counter(this,0x22,1);
        }
        peer_connection::send_block_requests(this_00);
      }
    }
  }
  return;
}

Assistant:

void torrent::on_piece_fail_sync(piece_index_t const piece, piece_block) try
	{
		if (m_abort) return;

		// the user may have called force_recheck, which clears
		// the piece picker
		if (has_picker())
		{
			// unlock the piece and restore it, as if no block was
			// ever downloaded for it.
			m_picker->restore_piece(piece);
		}

		update_gauge();
		// some peers that previously was no longer interesting may
		// now have become interesting, since we lack this one piece now.
		for (auto i = begin(); i != end();)
		{
			peer_connection* p = *i;
			// update_interest may disconnect the peer and
			// invalidate the iterator
			++i;
			// no need to do anything with peers that
			// already are interested. Gaining a piece may
			// only make uninteresting peers interesting again.
			if (p->is_interesting()) continue;
			p->update_interest();
			if (!m_abort)
			{
				if (request_a_block(*this, *p))
					inc_stats_counter(counters::hash_fail_piece_picks);
				p->send_block_requests();
			}
		}
	}
	catch (...) { handle_exception(); }